

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O2

int main(void)

{
  undefined1 *this;
  ostream *poVar1;
  reference piVar2;
  int iVar3;
  undefined1 local_238 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> std_3;
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ft;
  queue<int,_std::deque<int,_std::allocator<int>_>_> std_2;
  queue<int,_std::deque<int,_std::allocator<int>_>_> std;
  undefined1 local_a8 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ft_2;
  
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,(allocator_type *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  if (std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_node ==
      (_Map_pointer)
      std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size)
  {
    poVar1 = ::std::operator<<((ostream *)&::std::cout,"std is empty");
    ::std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (ft.c.m_chunks == 0) {
    poVar1 = ::std::operator<<((ostream *)&::std::cout," ft is empty");
    ::std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"size of std is: ");
  ::std::deque<int,_std::allocator<int>_>::size
            ((deque<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"size of ft  is: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,(allocator_type *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  for (local_a8._0_4_ = 1; (int)local_a8._0_4_ < 6; local_a8._0_4_ = local_a8._0_4_ + 1) {
    ::std::deque<int,_std::allocator<int>_>::push_back
              ((deque<int,_std::allocator<int>_> *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node,(value_type *)local_a8);
    ::ft::deque<int,_ft::allocator<int>_>::push_back
              ((deque<int,_ft::allocator<int>_> *)
               &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node,(value_type *)local_a8);
  }
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"size of std is: ");
  ::std::deque<int,_std::allocator<int>_>::size
            ((deque<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"size of ft  is: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"front of std: ");
  poVar1 = (ostream *)
           ::std::ostream::operator<<
                     (poVar1,*(int *)std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                     super__Deque_impl_data._M_map_size);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"back of std: ");
  if (std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_node ==
      (_Map_pointer)
      std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_cur) {
    std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
    _M_node = (_Map_pointer)
              (*(long *)(std.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last + -2) + 0x200);
  }
  poVar1 = (ostream *)
           ::std::ostream::operator<<
                     (poVar1,*(int *)((long)std.c.super__Deque_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Deque_impl_data._M_start._M_node + -4));
  ::std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"front of ft: ");
  poVar1 = (ostream *)::std::ostream::operator<<(poVar1,*(int *)ft.c.m_start._vptr_dequeIterator);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"back of ft: ");
  piVar2 = ::ft::deque<int,_ft::allocator<int>_>::back
                     ((deque<int,_ft::allocator<int>_> *)
                      &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node);
  poVar1 = (ostream *)::std::ostream::operator<<(poVar1,*piVar2);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ft");
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,(allocator_type *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  for (iVar3 = 10; iVar3 != 0x32; iVar3 = iVar3 + 10) {
    local_a8._0_4_ = iVar3;
    ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
              ((deque<int,_std::allocator<int>_> *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node,(int *)local_a8);
    local_a8._0_4_ = iVar3;
    ::ft::deque<int,_ft::allocator<int>_>::push_back
              ((deque<int,_ft::allocator<int>_> *)
               &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node,(value_type *)local_a8);
  }
  ::std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (deque<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ft");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (allocator_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  local_a8._0_4_ = 0xe;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,(int *)local_a8);
  local_a8._0_4_ = 8;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,(int *)local_a8);
  local_a8._0_4_ = 0x10;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,(int *)local_a8);
  local_a8._0_4_ = 10;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,(int *)local_a8);
  local_a8._0_4_ = 0x14;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,(int *)local_a8);
  local_a8._0_4_ = 0xe;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  local_a8._0_4_ = 8;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  local_a8._0_4_ = 0x10;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  local_a8._0_4_ = 10;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  local_a8._0_4_ = 0x14;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(value_type *)local_a8);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_238);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(allocator_type *)&ft_2.c.field_0x77);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::deque<int,_std::allocator<int>_>::operator=
            ((deque<int,_std::allocator<int>_> *)local_238,
             (deque<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::operator=
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,
             (queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_238,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ft");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_238);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x28;
  ::std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,4,
             (value_type *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(allocator_type *)local_a8);
  ::ft::list<int,_ft::allocator<int>_>::list<int>
            ((list<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,4,0x28,(allocator_type *)local_a8);
  ::std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (list<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::list<int,_ft::allocator<int>_>::list
            ((list<int,_ft::allocator<int>_> *)local_a8,
             (list<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  print<std::queue<int,std::__cxx11::list<int,std::allocator<int>>>>
            ((queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"std");
  print<ft::queue<int,ft::list<int,ft::allocator<int>>>>
            ((queue<int,_ft::list<int,_ft::allocator<int>_>_> *)local_a8,"ft");
  ::ft::list<int,_ft::allocator<int>_>::~list((list<int,_ft::allocator<int>_> *)local_a8);
  ::std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  ::ft::list<int,_ft::allocator<int>_>::~list
            ((list<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_238);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (allocator_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(allocator_type *)&ft_2.c.field_0x77);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 4;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 4;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_238,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 4;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 4;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0xf;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0xf;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_238,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0xf;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0xf;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x19;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x19;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_238,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x19;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x19;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_238,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ftFoo",(queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8
             ,"ftBar");
  this = &ft.c.field_0x70;
  ::std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)this);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x21;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)this,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::pop_front
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x21;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_238,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ftFoo",(queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8
             ,"ftBar");
  ::std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)local_238);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x21;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_238,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 2;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_238,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::pop_front((deque<int,_ft::allocator<int>_> *)local_a8);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x21;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 2;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_238,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ftFoo",(queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8
             ,"ftBar");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_238);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  return 0;
}

Assistant:

int 	main() {
	{ // constructors and some basic functions
		std::queue<int>	std;
		ft::queue<int>	ft;

		if (std.empty()) std::cout << "std is empty" << std::endl;
		if (ft.empty()) std::cout << " ft is empty" << std::endl;

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;
	}

	std::cout << "---" << std::endl;

	{ // push pop and element access at the front and back
		std::queue<int>	std;
		ft::queue<int>	ft;

		for (int i = 1; i <= 5; ++i) {
			std.push(i);
			ft.push(i);
		}

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;

		std::cout << "front of std: " << std.front() << std::endl;
		std::cout << "back of std: " << std.back() << std::endl;
		std::cout << "front of ft: " << ft.front() << std::endl;
		std::cout << "back of ft: " << ft.back() << std::endl;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // copy constructor
		std::queue<int>	stdCopy;
		ft::queue<int>	ftCopy;

		for (int i = 1; i <= 4; ++i) {
			stdCopy.push(i * 10);
			ftCopy.push(i * 10);
		}

		std::queue<int>	std(stdCopy);
		ft::queue<int>	ft(ftCopy);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // assignment operator
		std::queue<int>	stdCopy;
		ft::queue<int>	ftCopy;

		stdCopy.push(14);
		stdCopy.push(8);
		stdCopy.push(16);
		stdCopy.push(10);
		stdCopy.push(20);

		ftCopy.push(14);
		ftCopy.push(8);
		ftCopy.push(16);
		ftCopy.push(10);
		ftCopy.push(20);


		std::queue<int>	std;
		ft::queue<int>	ft;

		std = stdCopy;
		ft = ftCopy;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // different underlying container
		std::list<int>	stdL(4, 40);
		ft::list<int>	ftL(4, 40);

		std::queue<int, std::list<int> >	std(stdL);
		ft::queue<int, ft::list<int> >		ft(ftL);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // relational operators
		std::queue<int>	stdFoo, stdBar;
		ft::queue<int>	ftFoo, ftBar;

		stdFoo.push(4);
		stdBar.push(4);
		ftFoo.push(4);
		ftBar.push(4);

		stdFoo.push(15);
		stdBar.push(15);
		ftFoo.push(15);
		ftBar.push(15);

		stdFoo.push(25);
		stdBar.push(25);
		ftFoo.push(25);
		ftBar.push(25);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdFoo.pop();
		stdFoo.push(33);
		ftFoo.pop();
		ftFoo.push(33);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdBar.pop();
		stdBar.push(33);
		stdBar.push(2);
		ftBar.pop();
		ftBar.push(33);
		ftBar.push(2);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);
	}
	return 0;
}